

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::Pass::GenerateCopy
          (Pass *this,Instruction *object_to_copy,uint32_t new_type_id,
          Instruction *insertion_position)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  uint32_t uVar1;
  Analysis preserved_analyses;
  Op OVar2;
  Op OVar3;
  int iVar4;
  uint32_t uVar5;
  IRContext *pIVar6;
  ConstantManager *this_00;
  DefUseManager *pDVar7;
  Instruction *pIVar8;
  Instruction *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Instruction *object_to_copy_00;
  uint32_t local_14c;
  allocator<unsigned_int> local_145;
  uint32_t new_id_1;
  iterator local_140;
  size_type local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  Instruction *local_118;
  Instruction *extract_1;
  uint32_t local_108;
  uint32_t new_member_type_id;
  uint32_t orig_member_type_id;
  uint32_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_ids_1;
  allocator<unsigned_int> local_dd;
  uint32_t new_id;
  iterator local_d8;
  size_type local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  Instruction *local_b0;
  Instruction *extract;
  uint32_t i;
  uint32_t array_length;
  Constant *length_const;
  undefined1 local_90 [4];
  uint32_t length_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_ids;
  uint32_t new_element_type_id;
  uint32_t original_element_type_id;
  Instruction *new_type;
  Instruction *original_type;
  InstructionBuilder ir_builder;
  uint32_t original_type_id;
  ConstantManager *const_mgr;
  Instruction *insertion_position_local;
  uint32_t new_type_id_local;
  Instruction *object_to_copy_local;
  Pass *this_local;
  
  pIVar6 = context(this);
  this_00 = IRContext::get_constant_mgr(pIVar6);
  ir_builder._28_4_ = opt::Instruction::type_id(object_to_copy);
  if (ir_builder._28_4_ == new_type_id) {
    this_local._4_4_ = opt::Instruction::result_id(object_to_copy);
  }
  else {
    pIVar6 = context(this);
    preserved_analyses = opt::operator|(kAnalysisInstrToBlockMapping,kAnalysisBegin);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)&original_type,pIVar6,insertion_position,preserved_analyses);
    pDVar7 = get_def_use_mgr(this);
    pIVar8 = analysis::DefUseManager::GetDef(pDVar7,ir_builder._28_4_);
    pDVar7 = get_def_use_mgr(this);
    this_01 = analysis::DefUseManager::GetDef(pDVar7,new_type_id);
    OVar2 = opt::Instruction::opcode(this_01);
    OVar3 = opt::Instruction::opcode(pIVar8);
    if (OVar2 == OVar3) {
      OVar2 = opt::Instruction::opcode(pIVar8);
      if (OVar2 == OpTypeArray) {
        element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             opt::Instruction::GetSingleWordInOperand(pIVar8,0);
        element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             opt::Instruction::GetSingleWordInOperand(this_01,0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
        length_const._4_4_ = opt::Instruction::GetSingleWordInOperand(pIVar8,1);
        _i = analysis::ConstantManager::FindDeclaredConstant(this_00,length_const._4_4_);
        iVar4 = (*_i->_vptr_Constant[0xe])();
        if (CONCAT44(extraout_var,iVar4) == 0) {
          __assert_fail("length_const->AsIntConstant()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/pass.cpp"
                        ,0x72,
                        "uint32_t spvtools::opt::Pass::GenerateCopy(Instruction *, uint32_t, Instruction *)"
                       );
        }
        iVar4 = (*_i->_vptr_Constant[0xe])();
        extract._4_4_ = analysis::Constant::GetU32((Constant *)CONCAT44(extraout_var_00,iVar4));
        for (extract._0_4_ = 0;
            uVar1 = element_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
            (uint)extract < extract._4_4_; extract._0_4_ = (uint)extract + 1) {
          uVar5 = opt::Instruction::result_id(object_to_copy);
          new_id = (uint)extract;
          local_d8 = &new_id;
          local_d0 = 1;
          std::allocator<unsigned_int>::allocator(&local_dd);
          __l_00._M_len = local_d0;
          __l_00._M_array = local_d8;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_c8,__l_00,&local_dd);
          pIVar8 = InstructionBuilder::AddCompositeExtract
                             ((InstructionBuilder *)&original_type,uVar1,uVar5,&local_c8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c8);
          std::allocator<unsigned_int>::~allocator(&local_dd);
          local_b0 = pIVar8;
          element_ids_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               GenerateCopy(this,pIVar8,
                            (uint32_t)
                            element_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,insertion_position);
          if (element_ids_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
            this_local._4_4_ = 0;
            goto LAB_0086ae5e;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,
                     (value_type *)
                     ((long)&element_ids_1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage + 4));
        }
        pIVar8 = InstructionBuilder::AddCompositeConstruct
                           ((InstructionBuilder *)&original_type,new_type_id,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
        this_local._4_4_ = opt::Instruction::result_id(pIVar8);
LAB_0086ae5e:
        element_ids_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
      }
      else if (OVar2 == OpTypeStruct) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&orig_member_type_id);
        new_member_type_id = 0;
        while( true ) {
          uVar1 = new_member_type_id;
          uVar5 = opt::Instruction::NumInOperands(pIVar8);
          if (uVar5 <= uVar1) break;
          local_108 = opt::Instruction::GetSingleWordInOperand(pIVar8,new_member_type_id);
          extract_1._4_4_ = opt::Instruction::GetSingleWordInOperand(this_01,new_member_type_id);
          uVar1 = local_108;
          uVar5 = opt::Instruction::result_id(object_to_copy);
          new_id_1 = new_member_type_id;
          local_140 = &new_id_1;
          local_138 = 1;
          std::allocator<unsigned_int>::allocator(&local_145);
          __l._M_len = local_138;
          __l._M_array = local_140;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_130,__l,&local_145);
          object_to_copy_00 =
               InstructionBuilder::AddCompositeExtract
                         ((InstructionBuilder *)&original_type,uVar1,uVar5,&local_130);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_130);
          std::allocator<unsigned_int>::~allocator(&local_145);
          local_118 = object_to_copy_00;
          local_14c = GenerateCopy(this,object_to_copy_00,extract_1._4_4_,insertion_position);
          if (local_14c == 0) {
            this_local._4_4_ = 0;
            goto LAB_0086b018;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&orig_member_type_id,
                     &local_14c);
          new_member_type_id = new_member_type_id + 1;
        }
        pIVar8 = InstructionBuilder::AddCompositeConstruct
                           ((InstructionBuilder *)&original_type,new_type_id,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &orig_member_type_id);
        this_local._4_4_ = opt::Instruction::result_id(pIVar8);
LAB_0086b018:
        element_ids_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&orig_member_type_id);
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Pass::GenerateCopy(Instruction* object_to_copy, uint32_t new_type_id,
                            Instruction* insertion_position) {
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();

  uint32_t original_type_id = object_to_copy->type_id();
  if (original_type_id == new_type_id) {
    return object_to_copy->result_id();
  }

  InstructionBuilder ir_builder(
      context(), insertion_position,
      IRContext::kAnalysisInstrToBlockMapping | IRContext::kAnalysisDefUse);

  Instruction* original_type = get_def_use_mgr()->GetDef(original_type_id);
  Instruction* new_type = get_def_use_mgr()->GetDef(new_type_id);

  if (new_type->opcode() != original_type->opcode()) {
    return 0;
  }

  switch (original_type->opcode()) {
    case spv::Op::OpTypeArray: {
      uint32_t original_element_type_id =
          original_type->GetSingleWordInOperand(0);
      uint32_t new_element_type_id = new_type->GetSingleWordInOperand(0);

      std::vector<uint32_t> element_ids;
      uint32_t length_id = original_type->GetSingleWordInOperand(1);
      const analysis::Constant* length_const =
          const_mgr->FindDeclaredConstant(length_id);
      assert(length_const->AsIntConstant());
      uint32_t array_length = length_const->AsIntConstant()->GetU32();
      for (uint32_t i = 0; i < array_length; i++) {
        Instruction* extract = ir_builder.AddCompositeExtract(
            original_element_type_id, object_to_copy->result_id(), {i});
        uint32_t new_id =
            GenerateCopy(extract, new_element_type_id, insertion_position);
        if (new_id == 0) {
          return 0;
        }
        element_ids.push_back(new_id);
      }

      return ir_builder.AddCompositeConstruct(new_type_id, element_ids)
          ->result_id();
    }
    case spv::Op::OpTypeStruct: {
      std::vector<uint32_t> element_ids;
      for (uint32_t i = 0; i < original_type->NumInOperands(); i++) {
        uint32_t orig_member_type_id = original_type->GetSingleWordInOperand(i);
        uint32_t new_member_type_id = new_type->GetSingleWordInOperand(i);
        Instruction* extract = ir_builder.AddCompositeExtract(
            orig_member_type_id, object_to_copy->result_id(), {i});
        uint32_t new_id =
            GenerateCopy(extract, new_member_type_id, insertion_position);
        if (new_id == 0) {
          return 0;
        }
        element_ids.push_back(new_id);
      }
      return ir_builder.AddCompositeConstruct(new_type_id, element_ids)
          ->result_id();
    }
    default:
      // If we do not have an aggregate type, then we have a problem.  Either we
      // found multiple instances of the same type, or we are copying to an
      // incompatible type.  Either way the code is illegal. Leave the code as
      // is and let the caller deal with it.
      return 0;
  }
}